

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O0

JSON __thiscall
QPDFJob::json_schema
          (QPDFJob *this,int json_version,
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *keys)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  size_type sVar2;
  char *__s;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var3;
  bool bVar4;
  JSON JVar5;
  bool local_6e1;
  allocator<char> local_6a9;
  string local_6a8;
  JSON local_688;
  allocator<char> local_671;
  JSON local_670 [2];
  undefined1 local_650 [8];
  JSON attachments;
  key_type local_638;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_618;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5f8;
  JSON local_5d8;
  allocator<char> local_5c1;
  JSON local_5c0 [2];
  undefined1 local_5a0 [8];
  JSON encrypt;
  key_type local_588;
  allocator<char> local_561;
  undefined1 local_560 [8];
  string MODIFY_ANNOTATIONS;
  string local_538;
  JSON local_518;
  allocator<char> local_501;
  JSON local_500 [2];
  undefined1 local_4e0 [8];
  JSON acroform;
  key_type local_4c8;
  allocator<char> local_4a1;
  string local_4a0;
  JSON local_480;
  allocator<char> local_469;
  JSON local_468 [2];
  undefined1 local_448 [8];
  JSON outlines;
  key_type local_430;
  allocator<char> local_409;
  string local_408;
  JSON local_3e8;
  allocator<char> local_3d1;
  JSON local_3d0 [2];
  undefined1 local_3b0 [8];
  JSON labels;
  key_type local_398;
  allocator<char> local_371;
  string local_370;
  JSON local_350;
  allocator<char> local_339;
  JSON local_338 [2];
  undefined1 local_318 [8];
  JSON page;
  key_type local_300;
  allocator<char> local_2d9;
  string local_2d8;
  JSON local_2b8;
  allocator<char> local_2a1;
  JSON local_2a0 [2];
  JSON local_280;
  byte local_26b;
  byte local_26a;
  allocator<char> local_269;
  key_type local_268;
  allocator<char> local_241;
  string local_240;
  JSON local_220;
  allocator<char> local_209;
  JSON local_208 [2];
  undefined1 local_1e8 [8];
  JSON objectinfo;
  key_type local_1d0;
  allocator<char> local_1a9;
  string local_1a8;
  JSON local_188;
  allocator<char> local_171;
  JSON local_170 [2];
  JSON local_150;
  byte local_13b;
  byte local_13a;
  allocator<char> local_139;
  key_type local_138;
  bool local_112;
  allocator<char> local_111;
  undefined1 local_110 [6];
  bool all_keys;
  JSON local_f0;
  allocator<char> local_d9;
  JSON local_d8 [2];
  undefined1 local_b8 [8];
  JSON j_params;
  string local_a0;
  JSON local_80 [2];
  allocator<char> local_59;
  JSON local_58 [2];
  JSON local_38;
  byte local_21;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  QPDFJob *pQStack_10;
  int json_version_local;
  JSON *schema;
  
  local_21 = 0;
  local_20 = keys;
  keys_local._4_4_ = json_version;
  pQStack_10 = this;
  JSON::makeDictionary();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,"version",&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a0,"JSON format serial number; increased for non-compatible changes",
             (allocator<char> *)
             ((long)&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  JSON::makeString(local_80,&local_a0);
  JSON::addDictionaryMember(&local_38,(string *)this,local_58);
  JSON::~JSON(&local_38);
  JSON::~JSON(local_80);
  std::__cxx11::string::~string((string *)&local_a0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&j_params.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi + 7));
  std::__cxx11::string::~string((string *)local_58);
  std::allocator<char>::~allocator(&local_59);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_d8,"parameters",&local_d9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_110,
             "{\n  \"decodelevel\": \"decode level used to determine stream filterability\"\n}",
             &local_111);
  JSON::parse(&local_f0,(string *)local_110);
  JSON::addDictionaryMember((JSON *)local_b8,(string *)this,local_d8);
  JSON::~JSON(&local_f0);
  std::__cxx11::string::~string((string *)local_110);
  std::allocator<char>::~allocator(&local_111);
  std::__cxx11::string::~string((string *)local_d8);
  std::allocator<char>::~allocator(&local_d9);
  local_6e1 = true;
  if (local_20 !=
      (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       *)0x0) {
    local_6e1 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::empty(local_20);
  }
  psVar1 = local_20;
  local_112 = local_6e1;
  if (keys_local._4_4_ == 1) {
    local_13a = 0;
    local_13b = 0;
    bVar4 = true;
    if (local_6e1 == false) {
      std::allocator<char>::allocator();
      local_13a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_138,"objects",&local_139);
      local_13b = 1;
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(psVar1,&local_138);
      bVar4 = sVar2 != 0;
    }
    if ((local_13b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_138);
    }
    if ((local_13a & 1) != 0) {
      std::allocator<char>::~allocator(&local_139);
    }
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_170,"objects",&local_171);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1a8,
                 "{\n  \"<n n R|trailer>\": \"json representation of object\"\n}",&local_1a9);
      JSON::parse(&local_188,&local_1a8);
      JSON::addDictionaryMember(&local_150,(string *)this,local_170);
      JSON::~JSON(&local_150);
      JSON::~JSON(&local_188);
      std::__cxx11::string::~string((string *)&local_1a8);
      std::allocator<char>::~allocator(&local_1a9);
      std::__cxx11::string::~string((string *)local_170);
      std::allocator<char>::~allocator(&local_171);
    }
    psVar1 = local_20;
    objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _6_1_ = 0;
    objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _5_1_ = 0;
    bVar4 = true;
    if ((local_112 & 1U) == 0) {
      std::allocator<char>::allocator();
      objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _6_1_ = 1;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1d0,"objectinfo",
                 (allocator<char> *)
                 ((long)&objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
      objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
      _5_1_ = 1;
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(psVar1,&local_1d0);
      bVar4 = sVar2 != 0;
    }
    if ((objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._5_1_ & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_1d0);
    }
    if ((objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
         _M_pi._6_1_ & 1) != 0) {
      std::allocator<char>::~allocator
                ((allocator<char> *)
                 ((long)&objectinfo.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi + 7));
    }
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_208,"objectinfo",&local_209);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_240,
                 "{\n  \"<object-id>\": {\n    \"stream\": {\n      \"filter\": \"if stream, its filters, otherwise null\",\n      \"is\": \"whether the object is a stream\",\n      \"length\": \"if stream, its length, otherwise null\"\n    }\n  }\n}"
                 ,&local_241);
      JSON::parse(&local_220,&local_240);
      JSON::addDictionaryMember((JSON *)local_1e8,(string *)this,local_208);
      JSON::~JSON(&local_220);
      std::__cxx11::string::~string((string *)&local_240);
      std::allocator<char>::~allocator(&local_241);
      std::__cxx11::string::~string((string *)local_208);
      std::allocator<char>::~allocator(&local_209);
      JSON::~JSON((JSON *)local_1e8);
    }
  }
  else {
    local_26a = 0;
    local_26b = 0;
    bVar4 = true;
    if (local_6e1 == false) {
      std::allocator<char>::allocator();
      local_26a = 1;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_268,"qpdf",&local_269);
      local_26b = 1;
      sVar2 = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::count(psVar1,&local_268);
      bVar4 = sVar2 != 0;
    }
    if ((local_26b & 1) != 0) {
      std::__cxx11::string::~string((string *)&local_268);
    }
    if ((local_26a & 1) != 0) {
      std::allocator<char>::~allocator(&local_269);
    }
    if (bVar4) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)local_2a0,"qpdf",&local_2a1);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_2d8,
                 "[{\n  \"jsonversion\": \"numeric JSON version\",\n  \"pdfversion\": \"PDF version as x.y\",\n  \"pushedinheritedpageresources\": \"whether inherited attributes were pushed to the page level\",\n  \"calledgetallpages\": \"whether getAllPages was called\",\n  \"maxobjectid\": \"highest object ID in output, ignored on input\"\n},\n{\n  \"<obj:n n R|trailer>\": \"json representation of object\"\n}]"
                 ,&local_2d9);
      JSON::parse(&local_2b8,&local_2d8);
      JSON::addDictionaryMember(&local_280,(string *)this,local_2a0);
      JSON::~JSON(&local_280);
      JSON::~JSON(&local_2b8);
      std::__cxx11::string::~string((string *)&local_2d8);
      std::allocator<char>::~allocator(&local_2d9);
      std::__cxx11::string::~string((string *)local_2a0);
      std::allocator<char>::~allocator(&local_2a1);
    }
  }
  psVar1 = local_20;
  page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0;
  page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 0;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 1
    ;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_300,"pages",
               (allocator<char> *)
               ((long)&page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 1
    ;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_300);
    bVar4 = sVar2 != 0;
  }
  if ((page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
      & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_300);
  }
  if ((page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
      & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&page.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_338,"pages",&local_339);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_370,
               "[\n  {\n    \"contents\": [\n      \"reference to each content stream\"\n    ],\n    \"images\": [\n      {\n        \"bitspercomponent\": \"bits per component\",\n        \"colorspace\": \"color space\",\n        \"decodeparms\": [\n          \"decode parameters for image data\"\n        ],\n        \"filter\": [\n          \"filters applied to image data\"\n        ],\n        \"filterable\": \"whether image data can be decoded using the decode level qpdf was invoked with\",\n        \"height\": \"image height\",\n        \"name\": \"name of image in XObject table\",\n        \"object\": \"reference to image stream\",\n        \"width\": \"image width\"\n      }\n    ],\n    \"label\": \"page label dictionary, or null if none\",\n    \"object\": \"reference to original page object\",\n    \"outlines\": [\n      {\n        \"dest\": \"outline destination dictionary\",\n        \"object\": \"reference to outline that targets this page\",\n        \"title\": \"outline title\"\n      }\n    ],\n    \"pageposfrom1\": \"position of page in document numbering from 1\"\n  }\n]"
               ,&local_371);
    JSON::parse(&local_350,&local_370);
    JSON::addDictionaryMember((JSON *)local_318,(string *)this,local_338);
    JSON::~JSON(&local_350);
    std::__cxx11::string::~string((string *)&local_370);
    std::allocator<char>::~allocator(&local_371);
    std::__cxx11::string::~string((string *)local_338);
    std::allocator<char>::~allocator(&local_339);
    JSON::~JSON((JSON *)local_318);
  }
  psVar1 = local_20;
  labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ = 0
  ;
  labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ = 0
  ;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
         1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_398,"pagelabels",
               (allocator<char> *)
               ((long)&labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
         1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_398);
    bVar4 = sVar2 != 0;
  }
  if ((labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_398);
  }
  if ((labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&labels.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_3d0,"pagelabels",&local_3d1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_408,
               "[\n  {\n    \"index\": \"starting page position starting from zero\",\n    \"label\": \"page label dictionary\"\n  }\n]"
               ,&local_409);
    JSON::parse(&local_3e8,&local_408);
    JSON::addDictionaryMember((JSON *)local_3b0,(string *)this,local_3d0);
    JSON::~JSON(&local_3e8);
    std::__cxx11::string::~string((string *)&local_408);
    std::allocator<char>::~allocator(&local_409);
    std::__cxx11::string::~string((string *)local_3d0);
    std::allocator<char>::~allocator(&local_3d1);
    JSON::~JSON((JSON *)local_3b0);
  }
  psVar1 = local_20;
  outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
       0;
  outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
       0;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_430,"outlines",
               (allocator<char> *)
               ((long)&outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
         = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_430);
    bVar4 = sVar2 != 0;
  }
  if ((outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_430);
  }
  if ((outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&outlines.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_468,"outlines",&local_469);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4a0,
               "[\n  {\n    \"dest\": \"outline destination dictionary\",\n    \"destpageposfrom1\": \"position of destination page in document numbered from 1; null if not known\",\n    \"kids\": \"array of descendent outlines\",\n    \"object\": \"reference to this outline\",\n    \"open\": \"whether the outline is displayed expanded\",\n    \"title\": \"outline title\"\n  }\n]"
               ,&local_4a1);
    JSON::parse(&local_480,&local_4a0);
    JSON::addDictionaryMember((JSON *)local_448,(string *)this,local_468);
    JSON::~JSON(&local_480);
    std::__cxx11::string::~string((string *)&local_4a0);
    std::allocator<char>::~allocator(&local_4a1);
    std::__cxx11::string::~string((string *)local_468);
    std::allocator<char>::~allocator(&local_469);
    JSON::~JSON((JSON *)local_448);
  }
  psVar1 = local_20;
  acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
       0;
  acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
       0;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_4c8,"acroform",
               (allocator<char> *)
               ((long)&acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
         = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_4c8);
    bVar4 = sVar2 != 0;
  }
  if ((acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_4c8);
  }
  if ((acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&acroform.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_500,"acroform",&local_501);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_538,
               "{\n  \"fields\": [\n    {\n      \"alternativename\": \"alternative name of field -- this is the one usually shown to users\",\n      \"annotation\": {\n        \"annotationflags\": \"annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h\",\n        \"appearancestate\": \"appearance state -- can be used to determine value for checkboxes and radio buttons\",\n        \"object\": \"reference to the annotation object\"\n      },\n      \"choices\": \"for choices fields, the list of choices presented to the user\",\n      \"defaultvalue\": \"default value of field\",\n      \"fieldflags\": \"form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h\",\n      \"fieldtype\": \"field type\",\n      \"fullname\": \"full name of field\",\n      \"ischeckbox\": \"whether field is a checkbox\",\n      \"ischoice\": \"whether field is a list, combo, or dropdown\",\n      \"isradiobutton\": \"whether field is a radio button -- buttons in a single group share a parent\",\n      \"istext\": \"whether field is a text field\",\n      \"mappingname\": \"mapping name of field\",\n      \"object\": \"reference to this form field\",\n      \"pageposfrom1\": \"position of containing page numbered from 1\",\n      \"parent\": \"reference to this field\'s parent\",\n      \"partialname\": \"partial name of field\",\n      \"quadding\": \"field quadding -- number indicating left, center, or right\",\n      \"value\": \"value of field\"\n    }\n  ],\n  \"hasacroform\": \"whether the document has interactive forms\",\n  \"needappearances\": \"whether the form fields\' appearance streams need to be regenerated\"\n}"
               ,(allocator<char> *)(MODIFY_ANNOTATIONS.field_2._M_local_buf + 0xf));
    JSON::parse(&local_518,&local_538);
    JSON::addDictionaryMember((JSON *)local_4e0,(string *)this,local_500);
    JSON::~JSON(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    std::allocator<char>::~allocator
              ((allocator<char> *)(MODIFY_ANNOTATIONS.field_2._M_local_buf + 0xf));
    std::__cxx11::string::~string((string *)local_500);
    std::allocator<char>::~allocator(&local_501);
    JSON::~JSON((JSON *)local_4e0);
  }
  __s = "modifyannotations";
  if (keys_local._4_4_ == 1) {
    __s = "moddifyannotations";
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_560,__s,&local_561);
  std::allocator<char>::~allocator(&local_561);
  psVar1 = local_20;
  encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_ =
       0;
  encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_ =
       0;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._6_1_
         = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_588,"encrypt",
               (allocator<char> *)
               ((long)&encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._5_1_
         = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_588);
    bVar4 = sVar2 != 0;
  }
  if ((encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_588);
  }
  if ((encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
       _6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&encrypt.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_5c0,"encrypt",&local_5c1);
    std::operator+(&local_618,
                   "{\n  \"capabilities\": {\n    \"accessibility\": \"allow extraction for accessibility?\",\n    \"extract\": \"allow extraction?\",\n    \""
                   ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_560);
    std::operator+(&local_5f8,&local_618,
                   "\": \"allow modifying annotations?\",\n    \"modify\": \"allow all modifications?\",\n    \"modifyassembly\": \"allow modifying document assembly?\",\n    \"modifyforms\": \"allow modifying forms?\",\n    \"modifyother\": \"allow other modifications?\",\n    \"printhigh\": \"allow high resolution printing?\",\n    \"printlow\": \"allow low resolution printing?\"\n  },\n  \"encrypted\": \"whether the document is encrypted\",\n  \"ownerpasswordmatched\": \"whether supplied password matched owner password; always false for non-encrypted files\",\n  \"recovereduserpassword\": \"If the owner password was used to recover the user password, reveal user password; otherwise null\",\n  \"parameters\": {\n    \"P\": \"P value from Encrypt dictionary\",\n    \"R\": \"R value from Encrypt dictionary\",\n    \"V\": \"V value from Encrypt dictionary\",\n    \"bits\": \"encryption key bit length\",\n    \"filemethod\": \"encryption method for attachments\",\n    \"key\": \"encryption key; will be null unless --show-encryption-key was specified\",\n    \"method\": \"overall encryption method: none, mixed, RC4, AESv2, AESv3\",\n    \"streammethod\": \"encryption method for streams\",\n    \"stringmethod\": \"encryption method for string\"\n  },\n  \"userpasswordmatched\": \"whether supplied password matched user password; always false for non-encrypted files\"\n}"
                  );
    JSON::parse(&local_5d8,&local_5f8);
    JSON::addDictionaryMember((JSON *)local_5a0,(string *)this,local_5c0);
    JSON::~JSON(&local_5d8);
    std::__cxx11::string::~string((string *)&local_5f8);
    std::__cxx11::string::~string((string *)&local_618);
    std::__cxx11::string::~string((string *)local_5c0);
    std::allocator<char>::~allocator(&local_5c1);
    JSON::~JSON((JSON *)local_5a0);
  }
  psVar1 = local_20;
  attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _6_1_ = 0;
  attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
  _5_1_ = 0;
  bVar4 = true;
  if ((local_112 & 1U) == 0) {
    std::allocator<char>::allocator();
    attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _6_1_ = 1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_638,"attachments",
               (allocator<char> *)
               ((long)&attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
    attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi.
    _5_1_ = 1;
    sVar2 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(psVar1,&local_638);
    bVar4 = sVar2 != 0;
  }
  if ((attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_638);
  }
  if ((attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       ._6_1_ & 1) != 0) {
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&attachments.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi + 7));
  }
  if (bVar4) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_670,"attachments",&local_671)
    ;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6a8,
               "{\n  \"<attachment-key>\": {\n    \"filespec\": \"object containing the file spec\",\n    \"preferredcontents\": \"most preferred embedded file stream\",\n    \"preferredname\": \"most preferred file name\",\n    \"description\": \"description of attachment\",\n    \"names\": {\n      \"<name-key>\": \"file name for key\"\n    },\n    \"streams\": {\n      \"<stream-key>\": {\n        \"creationdate\": \"ISO-8601 creation date or null\",\n        \"modificationdate\": \"ISO-8601 modification date or null\",\n        \"mimetype\": \"mime type or null\",\n        \"checksum\": \"MD5 checksum or null\"\n      }\n    }\n  }\n}"
               ,&local_6a9);
    JSON::parse(&local_688,&local_6a8);
    JSON::addDictionaryMember((JSON *)local_650,(string *)this,local_670);
    JSON::~JSON(&local_688);
    std::__cxx11::string::~string((string *)&local_6a8);
    std::allocator<char>::~allocator(&local_6a9);
    std::__cxx11::string::~string((string *)local_670);
    std::allocator<char>::~allocator(&local_671);
    JSON::~JSON((JSON *)local_650);
  }
  local_21 = 1;
  std::__cxx11::string::~string((string *)local_560);
  JSON::~JSON((JSON *)local_b8);
  _Var3._M_pi = extraout_RDX;
  if ((local_21 & 1) == 0) {
    JSON::~JSON((JSON *)this);
    _Var3._M_pi = extraout_RDX_00;
  }
  JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var3._M_pi;
  JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (JSON)JVar5.m.super___shared_ptr<JSON::Members,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

JSON
QPDFJob::json_schema(int json_version, std::set<std::string>* keys)
{
    // Style: use all lower-case keys with no dashes or underscores. Choose array or dictionary
    // based on indexing. For example, we use a dictionary for objects because we want to index by
    // object ID and an array for pages because we want to index by position. The pages in the pages
    // array contain references back to the original object, which can be resolved in the objects
    // dictionary. When a PDF construct that maps back to an original object is represented
    // separately, use "object" as the key that references the original object.

    // This JSON object doubles as a schema and as documentation for our JSON output. Any schema
    // mismatch is a bug in qpdf. This helps to enforce our policy of consistently providing a known
    // structure where every documented key will always be present, which makes it easier to consume
    // our JSON. This is discussed in more depth in the manual.
    JSON schema = JSON::makeDictionary();
    schema.addDictionaryMember(
        "version",
        JSON::makeString("JSON format serial number; increased for non-compatible changes"));
    JSON j_params = schema.addDictionaryMember("parameters", JSON::parse(R"({
  "decodelevel": "decode level used to determine stream filterability"
})"));

    bool all_keys = ((keys == nullptr) || keys->empty());

    // The list of selectable top-level keys id duplicated in the following places: job.yml,
    // QPDFJob::json_schema, and QPDFJob::doJSON.
    if (json_version == 1) {
        if (all_keys || keys->count("objects")) {
            schema.addDictionaryMember("objects", JSON::parse(R"({
  "<n n R|trailer>": "json representation of object"
})"));
        }
        if (all_keys || keys->count("objectinfo")) {
            JSON objectinfo = schema.addDictionaryMember("objectinfo", JSON::parse(R"({
  "<object-id>": {
    "stream": {
      "filter": "if stream, its filters, otherwise null",
      "is": "whether the object is a stream",
      "length": "if stream, its length, otherwise null"
    }
  }
})"));
        }
    } else {
        if (all_keys || keys->count("qpdf")) {
            schema.addDictionaryMember("qpdf", JSON::parse(R"([{
  "jsonversion": "numeric JSON version",
  "pdfversion": "PDF version as x.y",
  "pushedinheritedpageresources": "whether inherited attributes were pushed to the page level",
  "calledgetallpages": "whether getAllPages was called",
  "maxobjectid": "highest object ID in output, ignored on input"
},
{
  "<obj:n n R|trailer>": "json representation of object"
}])"));
        }
    }
    if (all_keys || keys->count("pages")) {
        JSON page = schema.addDictionaryMember("pages", JSON::parse(R"([
  {
    "contents": [
      "reference to each content stream"
    ],
    "images": [
      {
        "bitspercomponent": "bits per component",
        "colorspace": "color space",
        "decodeparms": [
          "decode parameters for image data"
        ],
        "filter": [
          "filters applied to image data"
        ],
        "filterable": "whether image data can be decoded using the decode level qpdf was invoked with",
        "height": "image height",
        "name": "name of image in XObject table",
        "object": "reference to image stream",
        "width": "image width"
      }
    ],
    "label": "page label dictionary, or null if none",
    "object": "reference to original page object",
    "outlines": [
      {
        "dest": "outline destination dictionary",
        "object": "reference to outline that targets this page",
        "title": "outline title"
      }
    ],
    "pageposfrom1": "position of page in document numbering from 1"
  }
])"));
    }
    if (all_keys || keys->count("pagelabels")) {
        JSON labels = schema.addDictionaryMember("pagelabels", JSON::parse(R"([
  {
    "index": "starting page position starting from zero",
    "label": "page label dictionary"
  }
])"));
    }
    if (all_keys || keys->count("outlines")) {
        JSON outlines = schema.addDictionaryMember("outlines", JSON::parse(R"([
  {
    "dest": "outline destination dictionary",
    "destpageposfrom1": "position of destination page in document numbered from 1; null if not known",
    "kids": "array of descendent outlines",
    "object": "reference to this outline",
    "open": "whether the outline is displayed expanded",
    "title": "outline title"
  }
])"));
    }
    if (all_keys || keys->count("acroform")) {
        JSON acroform = schema.addDictionaryMember("acroform", JSON::parse(R"({
  "fields": [
    {
      "alternativename": "alternative name of field -- this is the one usually shown to users",
      "annotation": {
        "annotationflags": "annotation flags from /F -- see pdf_annotation_flag_e in qpdf/Constants.h",
        "appearancestate": "appearance state -- can be used to determine value for checkboxes and radio buttons",
        "object": "reference to the annotation object"
      },
      "choices": "for choices fields, the list of choices presented to the user",
      "defaultvalue": "default value of field",
      "fieldflags": "form field flags from /Ff -- see pdf_form_field_flag_e in qpdf/Constants.h",
      "fieldtype": "field type",
      "fullname": "full name of field",
      "ischeckbox": "whether field is a checkbox",
      "ischoice": "whether field is a list, combo, or dropdown",
      "isradiobutton": "whether field is a radio button -- buttons in a single group share a parent",
      "istext": "whether field is a text field",
      "mappingname": "mapping name of field",
      "object": "reference to this form field",
      "pageposfrom1": "position of containing page numbered from 1",
      "parent": "reference to this field's parent",
      "partialname": "partial name of field",
      "quadding": "field quadding -- number indicating left, center, or right",
      "value": "value of field"
    }
  ],
  "hasacroform": "whether the document has interactive forms",
  "needappearances": "whether the form fields' appearance streams need to be regenerated"
})"));
    }
    std::string MODIFY_ANNOTATIONS =
        (json_version == 1 ? "moddifyannotations" : "modifyannotations");
    if (all_keys || keys->count("encrypt")) {
        JSON encrypt = schema.addDictionaryMember("encrypt", JSON::parse(R"({
  "capabilities": {
    "accessibility": "allow extraction for accessibility?",
    "extract": "allow extraction?",
    ")" + MODIFY_ANNOTATIONS + R"(": "allow modifying annotations?",
    "modify": "allow all modifications?",
    "modifyassembly": "allow modifying document assembly?",
    "modifyforms": "allow modifying forms?",
    "modifyother": "allow other modifications?",
    "printhigh": "allow high resolution printing?",
    "printlow": "allow low resolution printing?"
  },
  "encrypted": "whether the document is encrypted",
  "ownerpasswordmatched": "whether supplied password matched owner password; always false for non-encrypted files",
  "recovereduserpassword": "If the owner password was used to recover the user password, reveal user password; otherwise null",
  "parameters": {
    "P": "P value from Encrypt dictionary",
    "R": "R value from Encrypt dictionary",
    "V": "V value from Encrypt dictionary",
    "bits": "encryption key bit length",
    "filemethod": "encryption method for attachments",
    "key": "encryption key; will be null unless --show-encryption-key was specified",
    "method": "overall encryption method: none, mixed, RC4, AESv2, AESv3",
    "streammethod": "encryption method for streams",
    "stringmethod": "encryption method for string"
  },
  "userpasswordmatched": "whether supplied password matched user password; always false for non-encrypted files"
})"));
    }
    if (all_keys || keys->count("attachments")) {
        JSON attachments = schema.addDictionaryMember("attachments", JSON::parse(R"({
  "<attachment-key>": {
    "filespec": "object containing the file spec",
    "preferredcontents": "most preferred embedded file stream",
    "preferredname": "most preferred file name",
    "description": "description of attachment",
    "names": {
      "<name-key>": "file name for key"
    },
    "streams": {
      "<stream-key>": {
        "creationdate": "ISO-8601 creation date or null",
        "modificationdate": "ISO-8601 modification date or null",
        "mimetype": "mime type or null",
        "checksum": "MD5 checksum or null"
      }
    }
  }
})"));
    }
    return schema;
}